

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O2

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  int iVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  StkId pTVar4;
  char *pcVar5;
  
  iVar1 = ar->i_ci;
  pCVar2 = L->base_ci;
  pcVar5 = findlocal(L,pCVar2 + iVar1,n);
  if (pcVar5 != (char *)0x0) {
    pTVar3 = L->top;
    pTVar4 = pCVar2[iVar1].base;
    pTVar4[(long)n + -1].value = pTVar3[-1].value;
    pTVar4[(long)n + -1].tt = pTVar3[-1].tt;
  }
  L->top = L->top + -1;
  return pcVar5;
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  CallInfo *ci = L->base_ci + ar->i_ci;
  const char *name = findlocal(L, ci, n);
  lua_lock(L);
  if (name)
      setobjs2s(L, ci->base + (n - 1), L->top - 1);
  L->top--;  /* pop value */
  lua_unlock(L);
  return name;
}